

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

xcb_rectangle_t client_initialize_rect(client *client,monitor *monitor)

{
  xcb_size_hints_t *pxVar1;
  uint uVar2;
  xcb_rectangle_t xVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)(client->rect).width;
  uVar6 = (uint)(client->rect).height;
  pxVar1 = client->size_hints;
  if ((pxVar1->flags & 2) == 0) {
    uVar2 = (uint)(ushort)(client->rect).x;
    uVar4 = (uint)(ushort)(client->rect).y;
  }
  else {
    uVar2 = pxVar1->x;
    if (0x7fff < (int)uVar2) {
      __assert_fail("client->size_hints->x <= INT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x89,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    uVar4 = pxVar1->y;
    if (0x7fff < (int)uVar4) {
      __assert_fail("client->size_hints->y <= INT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x8a,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
  }
  if ((pxVar1->flags & 8) != 0) {
    uVar5 = pxVar1->width;
    if (0xffff < (int)uVar5) {
      __assert_fail("client->size_hints->width <= UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x91,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
    uVar6 = pxVar1->height;
    if (0xffff < (int)uVar6) {
      __assert_fail("client->size_hints->height <= UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/client.c"
                    ,0x92,
                    "xcb_rectangle_t client_initialize_rect(const struct client *, const struct monitor *)"
                   );
    }
  }
  xVar3 = monitor_clamp_client_rect
                    (monitor,(xcb_rectangle_t)
                             ((ulong)(uVar2 & 0xffff) |
                             (ulong)(uVar4 << 0x10) |
                             (ulong)(uVar5 & 0xffff) << 0x20 | (ulong)(uVar6 & 0xffff) << 0x30));
  return xVar3;
}

Assistant:

static xcb_rectangle_t client_initialize_rect(const struct client *client,
                                              const struct monitor *monitor)
{
        xcb_rectangle_t new_rect = client->rect;

        if (client->size_hints->flags & XCB_ICCCM_SIZE_HINT_US_SIZE) {
                assert(client->size_hints->x <= INT16_MAX);
                assert(client->size_hints->y <= INT16_MAX);

                new_rect.x = (int16_t)client->size_hints->x;
                new_rect.y = (int16_t)client->size_hints->y;
        }

        if (client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_SIZE) {
                assert(client->size_hints->width <= UINT16_MAX);
                assert(client->size_hints->height <= UINT16_MAX);

                new_rect.width = (uint16_t)client->size_hints->width;
                new_rect.height = (uint16_t)client->size_hints->height;
        }

        return monitor_clamp_client_rect(monitor, new_rect);
}